

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerializer.cpp
# Opt level: O2

ISerializedValue * __thiscall
SimpleSerializer::GetISerializedValue(SimpleSerializer *this,char *propertyName)

{
  _Base_ptr p_Var1;
  uint __line;
  iterator iVar2;
  char *__assertion;
  allocator<char> local_39;
  key_type local_38;
  
  if (this->m_pCurrentObject == (IObject *)0x0) {
    __assertion = "m_pCurrentObject";
    __line = 0x72;
  }
  else if (propertyName == (char *)0x0) {
    __assertion = "propertyName";
    __line = 0x73;
  }
  else {
    if (this->m_bLoading != false) {
      p_Var1 = (this->m_CurrentSerialization)._M_node;
      if ((_Rb_tree_header *)p_Var1 != &(this->m_map)._M_t._M_impl.super__Rb_tree_header) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,propertyName,&local_39);
        iVar2 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>
                        *)&p_Var1[1]._M_left,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        if (iVar2._M_node != (_Base_ptr)&(this->m_CurrentSerialization)._M_node[1]._M_right) {
          return *(ISerializedValue **)(iVar2._M_node + 2);
        }
      }
      return (ISerializedValue *)0x0;
    }
    __assertion = "m_bLoading";
    __line = 0x74;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/RuntimeCompiledCPlusPlus/Aurora/RuntimeObjectSystem/SimpleSerializer/SimpleSerializer.cpp"
                ,__line,
                "virtual const ISerializedValue *SimpleSerializer::GetISerializedValue(const char *) const"
               );
}

Assistant:

const ISerializedValue* SimpleSerializer::GetISerializedValue(const char* propertyName) const
{
	assert( m_pCurrentObject );
	assert( propertyName );
	assert( m_bLoading );
	const ISerializedValue* pRet = NULL;

	//TSerializationMap::const_iterator found = m_map.find(ownerId);
	if (m_CurrentSerialization != m_map.end())
	{
		TValueGroup::const_iterator propertyFound = m_CurrentSerialization->second.find(propertyName);
		if (propertyFound != m_CurrentSerialization->second.end())
		{
			pRet = propertyFound->second;
		}
	}

	return pRet;
}